

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_leak_example.c
# Opt level: O0

int main(int argc,char **argv)

{
  void *__ptr;
  char *p;
  char **argv_local;
  int argc_local;
  
  mtrace();
  __ptr = malloc(0x10);
  free(__ptr);
  malloc(0x20);
  muntrace();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    mtrace();

    char *p = malloc(16);

    free(p);

    p = malloc(32);

    muntrace();

    return 0;
}